

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O1

auto_ptr<cmCryptoHash> __thiscall cmCryptoHash::New(cmCryptoHash *this,char *algo)

{
  int iVar1;
  cmCryptoHash *this_00;
  auto_ptr<cmCryptoHash> local_18;
  
  iVar1 = strcmp(algo,"MD5");
  if (iVar1 == 0) {
    this_00 = (cmCryptoHash *)operator_new(0x10);
    cmCryptoHash(this_00,AlgoMD5);
  }
  else {
    iVar1 = strcmp(algo,"SHA1");
    if (iVar1 == 0) {
      this_00 = (cmCryptoHash *)operator_new(0x10);
      cmCryptoHash(this_00,AlgoSHA1);
    }
    else {
      iVar1 = strcmp(algo,"SHA224");
      if (iVar1 == 0) {
        this_00 = (cmCryptoHash *)operator_new(0x10);
        cmCryptoHash(this_00,AlgoSHA224);
      }
      else {
        iVar1 = strcmp(algo,"SHA256");
        if (iVar1 == 0) {
          this_00 = (cmCryptoHash *)operator_new(0x10);
          cmCryptoHash(this_00,AlgoSHA256);
        }
        else {
          iVar1 = strcmp(algo,"SHA384");
          if (iVar1 == 0) {
            this_00 = (cmCryptoHash *)operator_new(0x10);
            cmCryptoHash(this_00,AlgoSHA384);
          }
          else {
            iVar1 = strcmp(algo,"SHA512");
            if (iVar1 == 0) {
              this_00 = (cmCryptoHash *)operator_new(0x10);
              cmCryptoHash(this_00,AlgoSHA512);
            }
            else {
              iVar1 = strcmp(algo,"SHA3_224");
              if (iVar1 == 0) {
                this_00 = (cmCryptoHash *)operator_new(0x10);
                cmCryptoHash(this_00,AlgoSHA3_224);
              }
              else {
                iVar1 = strcmp(algo,"SHA3_256");
                if (iVar1 == 0) {
                  this_00 = (cmCryptoHash *)operator_new(0x10);
                  cmCryptoHash(this_00,AlgoSHA3_256);
                }
                else {
                  iVar1 = strcmp(algo,"SHA3_384");
                  if (iVar1 == 0) {
                    this_00 = (cmCryptoHash *)operator_new(0x10);
                    cmCryptoHash(this_00,AlgoSHA3_384);
                  }
                  else {
                    iVar1 = strcmp(algo,"SHA3_512");
                    if (iVar1 != 0) {
                      *(undefined8 *)this = 0;
                      goto LAB_00130c17;
                    }
                    this_00 = (cmCryptoHash *)operator_new(0x10);
                    cmCryptoHash(this_00,AlgoSHA3_512);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  *(cmCryptoHash **)this = this_00;
LAB_00130c17:
  local_18.x_ = (cmCryptoHash *)0x0;
  cm::auto_ptr<cmCryptoHash>::~auto_ptr(&local_18);
  return (auto_ptr<cmCryptoHash>)this;
}

Assistant:

CM_AUTO_PTR<cmCryptoHash> cmCryptoHash::New(const char* algo)
{
  if (strcmp(algo, "MD5") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoMD5));
  }
  if (strcmp(algo, "SHA1") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA1));
  }
  if (strcmp(algo, "SHA224") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA224));
  }
  if (strcmp(algo, "SHA256") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA256));
  }
  if (strcmp(algo, "SHA384") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA384));
  }
  if (strcmp(algo, "SHA512") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA512));
  }
  if (strcmp(algo, "SHA3_224") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA3_224));
  }
  if (strcmp(algo, "SHA3_256") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA3_256));
  }
  if (strcmp(algo, "SHA3_384") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA3_384));
  }
  if (strcmp(algo, "SHA3_512") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA3_512));
  }
  return CM_AUTO_PTR<cmCryptoHash>(CM_NULLPTR);
}